

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringview.h
# Opt level: O3

bool __thiscall QDBusUtil::isValidPartOfObjectPath(QDBusUtil *this,QStringView part)

{
  ushort uVar1;
  QDBusUtil *pQVar2;
  
  if (this == (QDBusUtil *)0x0) {
    return false;
  }
  if (0 < (long)this) {
    pQVar2 = (QDBusUtil *)0x0;
    do {
      uVar1 = *(ushort *)(part.m_size + (long)pQVar2 * 2);
      if ((0x19 < uVar1 - 0x61 && 9 < uVar1 - 0x30) && (uVar1 != 0x5f && 0x19 < uVar1 - 0x41)) {
        return false;
      }
      pQVar2 = pQVar2 + 1;
    } while (this != pQVar2);
  }
  return true;
}

Assistant:

[[nodiscard]] constexpr bool empty() const noexcept { return size() == 0; }